

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

ParseResult *
read_list(ParseResult *__return_storage_ptr__,istream *is,shared_ptr<ASTNode> *node,bool square)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  allocator local_69;
  string local_68;
  __shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2> local_48;
  
  ((node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type = LIST;
  skip_whitespace(is);
  iVar3 = std::istream::peek();
  do {
    if (iVar3 == -1) {
      std::__cxx11::string::string((string *)&local_68,"Unclosed list literal",&local_69);
      ParseResult::ParseResult(__return_storage_ptr__,&local_68);
LAB_00112fc7:
      std::__cxx11::string::~string((string *)&local_68);
      return __return_storage_ptr__;
    }
    if ((iVar3 == 0x29) || (iVar3 == 0x5d)) {
      std::istream::get();
      if ((iVar3 != 0x5d) != square) {
        std::__shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_48,&node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>);
        _Var2._M_pi = local_48._M_refcount._M_pi;
        peVar1 = local_48._M_ptr;
        __return_storage_ptr__->result = OK;
        local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_48._M_ptr = (element_type *)0x0;
        (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = peVar1;
        (__return_storage_ptr__->node).super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var2._M_pi;
        (__return_storage_ptr__->error)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->error).field_2;
        (__return_storage_ptr__->error)._M_string_length = 0;
        (__return_storage_ptr__->error).field_2._M_local_buf[0] = '\0';
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::string((string *)&local_68,"Wrong closing bracket",&local_69);
      ParseResult::ParseResult(__return_storage_ptr__,&local_68);
      goto LAB_00112fc7;
    }
    read_object(__return_storage_ptr__,is);
    if (__return_storage_ptr__->result != OK) {
      return __return_storage_ptr__;
    }
    std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::
    push_back(&((node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->list,
              &__return_storage_ptr__->node);
    iVar3 = skip_whitespace(is);
    ParseResult::~ParseResult(__return_storage_ptr__);
  } while( true );
}

Assistant:

static ParseResult read_list(std::istream &is, const std::shared_ptr<ASTNode> &node, bool square)
{
    node->type = ast_type_t::LIST;
    skip_whitespace(is);
    int c = is.peek();
    while(c != EOF && c != ')' && c != ']')
    {
        auto object = read_object(is);
        if(object.result != parse_result_t::OK)
            return object;
        node->list.push_back(object.node);
        c = skip_whitespace(is);
    }
    if(c == EOF)
        return ParseResult("Unclosed list literal");
    is.get();
    if((c == ']') != square)
        return ParseResult("Wrong closing bracket");
    return ParseResult(node);
}